

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O0

void client_connect(void)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_connect_t *connect_req;
  sockaddr_in addr;
  
  pvVar2 = malloc(0x68);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&connect_req);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-multiple-listen.c"
            ,0x51,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (pvVar2 == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-multiple-listen.c"
            ,0x52,"connect_req","!=","NULL",0,"!=",0);
    abort();
  }
  uVar3 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar3,&client);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-multiple-listen.c"
            ,0x55,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_connect(pvVar2,&client,&connect_req,connect_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-multiple-listen.c"
            ,0x5b,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_tcp_t* client = (uv_tcp_t*)malloc(sizeof *client);
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_NOT_NULL(client);
  ASSERT_NOT_NULL(connect_req);

  r = uv_tcp_init(uv_default_loop(), client);
  ASSERT_OK(r);

  r = uv_tcp_connect(connect_req,
                     client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}